

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall btGeneric6DofConstraint::calculateAngleInfo(btGeneric6DofConstraint *this)

{
  btVector3 *this_00;
  btVector3 bVar1;
  btVector3 axis2;
  btVector3 axis0;
  btMatrix3x3 relative_frame;
  btVector3 local_98;
  btMatrix3x3 local_88;
  btMatrix3x3 local_58;
  
  btMatrix3x3::inverse(&(this->m_calculatedTransformA).m_basis);
  operator*(&local_58,&local_88,&(this->m_calculatedTransformB).m_basis);
  matrixToEulerXYZ(&local_58,&this->m_calculatedAxisAngleDiff);
  local_88.m_el[0].m_floats[1] = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  local_88.m_el[0].m_floats[0] =
       (btScalar)(int)*(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
  local_88.m_el[0].m_floats[2] = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  local_88.m_el[0].m_floats[3] = 0.0;
  local_98.m_floats[1] = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  local_98.m_floats[0] =
       (btScalar)(int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2);
  local_98.m_floats[2] = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  local_98.m_floats[3] = 0.0;
  bVar1 = btVector3::cross(&local_98,local_88.m_el);
  this_00 = this->m_calculatedAxis + 1;
  *&this->m_calculatedAxis[1].m_floats = bVar1.m_floats;
  bVar1 = btVector3::cross(this_00,&local_98);
  *&this->m_calculatedAxis[0].m_floats = bVar1.m_floats;
  bVar1 = btVector3::cross(local_88.m_el,this_00);
  *&this->m_calculatedAxis[2].m_floats = bVar1.m_floats;
  btVector3::normalize(this->m_calculatedAxis);
  btVector3::normalize(this_00);
  btVector3::normalize(this->m_calculatedAxis + 2);
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff);
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
	btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);

	m_calculatedAxis[1] = axis2.cross(axis0);
	m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
	m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}